

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int compression_code_bzip2(archive *a,la_zstream *lastrm,la_zaction action)

{
  bz_stream *strm_00;
  uint uVar1;
  int r;
  bz_stream *strm;
  la_zaction action_local;
  la_zstream *lastrm_local;
  archive *a_local;
  
  strm_00 = (bz_stream *)lastrm->real_stream;
  strm_00->next_in = (char *)lastrm->next_in;
  strm_00->avail_in = (uint)lastrm->avail_in;
  strm_00->total_in_lo32 = (uint)lastrm->total_in;
  strm_00->total_in_hi32 = *(uint *)((long)&lastrm->total_in + 4);
  strm_00->next_out = (char *)lastrm->next_out;
  strm_00->avail_out = (uint)lastrm->avail_out;
  strm_00->total_out_lo32 = (uint)lastrm->total_out;
  strm_00->total_out_hi32 = *(uint *)((long)&lastrm->total_out + 4);
  uVar1 = BZ2_bzCompress(strm_00,(uint)(action == ARCHIVE_Z_FINISH) * 2);
  lastrm->next_in = (uint8_t *)strm_00->next_in;
  lastrm->avail_in = (ulong)strm_00->avail_in;
  lastrm->total_in = *(uint64_t *)&strm_00->total_in_lo32;
  lastrm->next_out = (uint8_t *)strm_00->next_out;
  lastrm->avail_out = (ulong)strm_00->avail_out;
  lastrm->total_out = *(uint64_t *)&strm_00->total_out_lo32;
  if ((uVar1 == 1) || (uVar1 == 3)) {
    a_local._4_4_ = 0;
  }
  else if (uVar1 == 4) {
    a_local._4_4_ = 1;
  }
  else {
    archive_set_error(a,-1,"Bzip2 compression failed: BZ2_bzCompress() call returned status %d",
                      (ulong)uVar1);
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
compression_code_bzip2(struct archive *a,
    struct la_zstream *lastrm, enum la_zaction action)
{
	bz_stream *strm;
	int r;

	strm = (bz_stream *)lastrm->real_stream;
	/* bzlib.h is not const-correct, so we need this one bit
	 * of ugly hackery to convert a const * pointer to
	 * a non-const pointer. */
	strm->next_in = (char *)(uintptr_t)(const void *)lastrm->next_in;
	strm->avail_in = lastrm->avail_in;
	strm->total_in_lo32 = (uint32_t)(lastrm->total_in & 0xffffffff);
	strm->total_in_hi32 = (uint32_t)(lastrm->total_in >> 32);
	strm->next_out = (char *)lastrm->next_out;
	strm->avail_out = lastrm->avail_out;
	strm->total_out_lo32 = (uint32_t)(lastrm->total_out & 0xffffffff);
	strm->total_out_hi32 = (uint32_t)(lastrm->total_out >> 32);
	r = BZ2_bzCompress(strm,
	    (action == ARCHIVE_Z_FINISH)? BZ_FINISH: BZ_RUN);
	lastrm->next_in = (const unsigned char *)strm->next_in;
	lastrm->avail_in = strm->avail_in;
	lastrm->total_in =
	    (((uint64_t)(uint32_t)strm->total_in_hi32) << 32)
	    + (uint64_t)(uint32_t)strm->total_in_lo32;
	lastrm->next_out = (unsigned char *)strm->next_out;
	lastrm->avail_out = strm->avail_out;
	lastrm->total_out =
	    (((uint64_t)(uint32_t)strm->total_out_hi32) << 32)
	    + (uint64_t)(uint32_t)strm->total_out_lo32;
	switch (r) {
	case BZ_RUN_OK:     /* Non-finishing */
	case BZ_FINISH_OK:  /* Finishing: There's more work to do */
		return (ARCHIVE_OK);
	case BZ_STREAM_END: /* Finishing: all done */
		/* Only occurs in finishing case */
		return (ARCHIVE_EOF);
	default:
		/* Any other return value indicates an error */
		archive_set_error(a, ARCHIVE_ERRNO_MISC,
		    "Bzip2 compression failed:"
		    " BZ2_bzCompress() call returned status %d", r);
		return (ARCHIVE_FATAL);
	}
}